

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O0

int generate_shapes(map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                    *faces_map,
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *materials_map,string *geo_file_path)

{
  pointer *this;
  int iVar1;
  _Self __position;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  size_type sVar5;
  pointer ppVar6;
  ostream *poVar7;
  reference piVar8;
  pointer ppVar9;
  string local_530 [8];
  string curve_loop;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_500;
  iterator final;
  iterator vector_iterator;
  ostringstream curve;
  _Self local_370;
  _Base_ptr local_368;
  int local_35c;
  _Base_ptr local_358;
  int local_350;
  undefined1 local_34a;
  byte local_349;
  int submaterial_loop_counter;
  bool timed_out;
  bool current_shape_complete;
  _Self local_340;
  undefined1 local_338 [8];
  vector<int,_std::allocator<int>_> current_shape_vector;
  iterator current_faces_iterator;
  int local_310;
  int current_head;
  int origin;
  int faces_used_counter;
  int all_used_requirement;
  bool new_start_found;
  pair<int,_line> local_2e4;
  undefined1 local_2d4 [8];
  line temp;
  undefined1 local_2b8 [8];
  map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> current_faces_map;
  int local_27c;
  bool error_reached;
  iterator iStack_278;
  int total_shapes_count;
  iterator material_being_shaped;
  iterator placeholder;
  _Self local_240;
  iterator faces_iterator;
  bool unable_to_complete_shape;
  string local_228 [8];
  ofstream geo_file;
  string *geo_file_path_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *materials_map_local;
  map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
  *faces_map_local;
  
  std::ofstream::ofstream(local_228);
  std::operator|(_S_out,_S_app);
  std::ofstream::open(local_228,(_Ios_Openmode)geo_file_path);
  std::operator<<((ostream *)local_228,
                  "//======================== Material Shapes =========================\n");
  faces_iterator._M_node._3_1_ = 0;
  local_240._M_node =
       (_Base_ptr)
       std::
       map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
       ::begin(faces_map);
  while( true ) {
    placeholder = std::
                  map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                  ::end(faces_map);
    bVar2 = std::operator!=(&local_240,&placeholder);
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->(&local_240);
    __position._M_node = local_240._M_node;
    if ((ppVar4->second).face_type == 3) {
      std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator++(&local_240,0);
      std::
      map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>::
      erase_abi_cxx11_((map<int,face_properties,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
                        *)faces_map,(iterator)__position._M_node);
    }
    else {
      material_being_shaped._M_node =
           (_Base_ptr)
           std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator++(&local_240,0);
    }
  }
  iStack_278 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(materials_map);
  local_27c = 0;
  bVar2 = false;
  do {
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(materials_map);
    bVar3 = std::operator!=(&stack0xfffffffffffffd88,
                            (_Self *)&current_faces_map._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
    if (!bVar3) {
      faces_map_local._4_4_ = (uint)bVar2;
      std::ofstream::~ofstream(local_228);
      return faces_map_local._4_4_;
    }
    std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>::map
              ((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> *)
               local_2b8);
    local_240._M_node =
         (_Base_ptr)
         std::
         map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
         ::begin(faces_map);
    while( true ) {
      temp._4_8_ = std::
                   map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                   ::end(faces_map);
      bVar2 = std::operator!=(&local_240,(_Self *)&temp.b);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                         (&local_240);
      iVar1 = (ppVar4->second).parent_materials[0];
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&stack0xfffffffffffffd88);
      if (iVar1 == ppVar9->first) {
LAB_00182908:
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                           (&local_240);
        local_2d4._0_4_ = (ppVar4->second).first_node;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                           (&local_240);
        local_2d4._4_4_ = (ppVar4->second).second_node;
        temp.a._0_1_ = 0;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                           (&local_240);
        std::pair<int,_line>::pair<line_&,_true>(&local_2e4,&ppVar4->first,(line *)local_2d4);
        std::map<int,line,std::less<int>,std::allocator<std::pair<int_const,line>>>::
        insert<std::pair<int,line>>
                  ((map<int,line,std::less<int>,std::allocator<std::pair<int_const,line>>> *)
                   local_2b8,&local_2e4);
      }
      else {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator->
                           (&local_240);
        iVar1 = (ppVar4->second).parent_materials[1];
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&stack0xfffffffffffffd88);
        if (iVar1 == ppVar9->first) goto LAB_00182908;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_face_properties>_>::operator++(&local_240,0);
    }
    bVar2 = false;
    sVar5 = std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>::size
                      ((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                        *)local_2b8);
    current_head = 0;
    local_310 = 0;
    current_faces_iterator._M_node._4_4_ = 0;
    current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                  ::begin((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                           *)local_2b8);
    while (bVar3 = check_for_completion((int)sVar5,current_head),
          !bVar3 && (faces_iterator._M_node._3_1_ & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_338)
      ;
      while (!bVar2) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                            &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((ppVar6->second).used & 1U) == 1) {
          local_340._M_node =
               (_Base_ptr)
               std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>::
               end((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> *)
                   local_2b8);
          bVar3 = std::operator!=((_Self *)&current_shape_vector.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage,&local_340);
          if (bVar3) {
            _submaterial_loop_counter =
                 std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator++
                           ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                            &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0);
          }
          else {
            faces_iterator._M_node._3_1_ = 1;
          }
        }
        else {
          bVar2 = true;
          this = &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)this);
          local_310 = (ppVar6->second).a;
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)this);
          current_faces_iterator._M_node._4_4_ = (ppVar6->second).b;
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)this);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_338,&ppVar6->first);
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                              &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          (ppVar6->second).used = true;
          current_head = current_head + 1;
        }
      }
      local_349 = 0;
      local_34a = 0;
      local_350 = 0;
      while ((local_349 & 1) == 0 && (faces_iterator._M_node._3_1_ & 1) == 0) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                            &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((ppVar6->second).used & 1U) == 0) {
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                              &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (current_faces_iterator._M_node._4_4_ == (ppVar6->second).a) {
            ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            current_faces_iterator._M_node._4_4_ = (ppVar6->second).b;
            if (current_faces_iterator._M_node._4_4_ == local_310) {
              local_349 = 1;
              local_27c = local_27c + 1;
            }
            ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_338,&ppVar6->first);
            ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            (ppVar6->second).used = true;
            current_head = current_head + 1;
            local_358 = (_Base_ptr)
                        std::
                        map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                        ::begin((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                                 *)local_2b8);
            current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_358;
          }
          else {
            ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (current_faces_iterator._M_node._4_4_ == (ppVar6->second).b) {
              ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                  &current_shape_vector.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              current_faces_iterator._M_node._4_4_ = (ppVar6->second).a;
              if (current_faces_iterator._M_node._4_4_ == local_310) {
                local_349 = 1;
                local_27c = local_27c + 1;
              }
              ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                  &current_shape_vector.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              local_35c = -ppVar6->first;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_338,&local_35c);
              ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                                  &current_shape_vector.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              (ppVar6->second).used = true;
              current_head = current_head + 1;
              local_368 = (_Base_ptr)
                          std::
                          map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                          ::begin((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                                   *)local_2b8);
              current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)local_368;
            }
          }
        }
        local_370._M_node =
             (_Base_ptr)
             std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>::end
                       ((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
                         *)local_2b8);
        bVar3 = std::operator!=((_Self *)&current_shape_vector.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage,&local_370);
        if (bVar3) {
          std::_Rb_tree_iterator<std::pair<const_int,_line>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_int,_line>_> *)
                     &current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0);
        }
        else if ((local_349 & 1) == 0) {
          faces_iterator._M_node._3_1_ = 1;
        }
        local_350 = local_350 + 1;
        if (999999 < local_350) {
          faces_iterator._M_node._3_1_ = 1;
        }
      }
      if ((local_349 & 1) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vector_iterator);
        poVar7 = std::operator<<((ostream *)&vector_iterator,"Curve Loop(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        std::operator<<(poVar7,") = {");
        final = std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_338);
        local_500._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_338);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
                  (&local_500,0);
        while (bVar2 = __gnu_cxx::operator!=(&final,&local_500), bVar2) {
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&final);
          poVar7 = (ostream *)std::ostream::operator<<(&vector_iterator,*piVar8);
          std::operator<<(poVar7,", ");
          curve_loop.field_2._8_8_ =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&final,0);
        }
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&final);
        poVar7 = (ostream *)std::ostream::operator<<(&vector_iterator,*piVar8);
        std::operator<<(poVar7,"};\n");
        std::__cxx11::ostringstream::str();
        std::operator<<((ostream *)local_228,local_530);
        poVar7 = std::operator<<((ostream *)local_228,"Plane Surface(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        poVar7 = std::operator<<(poVar7,") = {");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        std::operator<<(poVar7,"};\n");
        poVar7 = std::operator<<((ostream *)local_228,"Physical Surface(\"");
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&stack0xfffffffffffffd88);
        poVar7 = std::operator<<(poVar7,(string *)&ppVar9->second);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        poVar7 = std::operator<<(poVar7,"\") = {");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        std::operator<<(poVar7,"};\n");
        bVar2 = false;
        std::__cxx11::string::~string(local_530);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vector_iterator);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_338);
    }
    bVar2 = (faces_iterator._M_node._3_1_ & 1) == 1;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&stack0xfffffffffffffd88,0);
    std::map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>::~map
              ((map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> *)
               local_2b8);
  } while( true );
}

Assistant:

int generate_shapes(std::map<int, face_properties> &faces_map,
                    std::map<int, std::string> &materials_map,
                    const std::string &geo_file_path)
{
    std::ofstream geo_file;
    geo_file.open(geo_file_path, std::ios::out | std::ios::app);
    geo_file << "//======================== Material Shapes =========================\n";
    bool unable_to_complete_shape = false;
    //First remove the insider faces as we do not require them------------------------
    std::map<int, face_properties>::iterator faces_iterator = faces_map.begin();
    while (faces_iterator != faces_map.end())
    {
        if (faces_iterator->second.face_type == 3)
        {
            std::map<int, face_properties>::iterator placeholder = faces_iterator;
            faces_iterator++;
            faces_map.erase(placeholder);
        }
        else
        {
            faces_iterator++;
        }
    }
    //============================== Shape Finder Code ==============================
    std::map<int, std::string>::iterator material_being_shaped = materials_map.begin();
    int total_shapes_count = 0;
    bool error_reached = false;
    while (material_being_shaped != materials_map.end())
    {
        std::map<int, line> current_faces_map;
        faces_iterator = faces_map.begin();
        // Create a map of all the faces that are borders for this material type
        while (faces_iterator != faces_map.end())
        {
            // if face is child of parent material and is a boundary, add it to the allowable map for border placement.
            if ((faces_iterator->second.parent_materials[0] == material_being_shaped->first) || (faces_iterator->second.parent_materials[1] == material_being_shaped->first))
            {
                line temp;
                temp.a = faces_iterator->second.first_node;
                temp.b = faces_iterator->second.second_node;
                temp.used = false;
                current_faces_map.insert(std::pair<int, line>(faces_iterator->first, temp));
            }
            faces_iterator++;
        }
        // This section looks for loops
        bool new_start_found = false;
        int all_used_requirement = current_faces_map.size();
        int faces_used_counter = 0;
        int origin = 0;
        int current_head = 0;
        std::map<int, line>::iterator current_faces_iterator = current_faces_map.begin();
        // Internal loop to complete all material shapes
        while ((check_for_completion(all_used_requirement, faces_used_counter) == false) && (unable_to_complete_shape == false))
        {
            std::vector<int> current_shape_vector;
            while (new_start_found == false)
            {
                if (current_faces_iterator->second.used == true)
                {
                    if (current_faces_iterator != current_faces_map.end())
                    {
                        current_faces_iterator++;
                    }
                    else
                    {
                        unable_to_complete_shape = true; //Means all shapes were not completed without causing an error
                    }
                }
                else
                {
                    new_start_found = true;
                    origin = current_faces_iterator->second.a;
                    current_head = current_faces_iterator->second.b;
                    current_shape_vector.push_back(current_faces_iterator->first);
                    current_faces_iterator->second.used = true;
                    faces_used_counter++;
                }
            }
            bool current_shape_complete = false;
            bool timed_out = false;
            int submaterial_loop_counter = 0;
            while ((current_shape_complete == false) && (unable_to_complete_shape == false))
            {
                if (current_faces_iterator->second.used == false)
                {
                    if (current_head == current_faces_iterator->second.a)
                    {
                        current_head = current_faces_iterator->second.b;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(current_faces_iterator->first);
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin(); //Send back to start to check for previously skipped entries that might be relevant now
                    }
                    else if (current_head == current_faces_iterator->second.b)
                    {
                        current_head = current_faces_iterator->second.a;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(-(current_faces_iterator->first));
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin();
                    }
                }
                if (current_faces_iterator != current_faces_map.end())
                {
                    current_faces_iterator++;
                }
                else
                {
                    if (current_shape_complete == false)
                    {
                        unable_to_complete_shape = true; //never found origin before faces map ended
                    }
                }
                submaterial_loop_counter++;
                if (submaterial_loop_counter >= LOOPTIMEOUT)
                {
                    unable_to_complete_shape = true; //timeout
                }
            }
            if (current_shape_complete == true)
            {
                // plot the vector with a unique curve loop ID & make it a child of physical group
                std::ostringstream curve;
                curve << "Curve Loop(" << total_shapes_count << ") = {";
                auto vector_iterator = current_shape_vector.begin();
                auto final = current_shape_vector.end();
                final--;
                while (vector_iterator != final)
                {
                    curve << *vector_iterator << ", ";
                    vector_iterator++;
                }
                curve << *vector_iterator << "};\n";
                std::string curve_loop = curve.str();
                geo_file << curve_loop;
                geo_file << "Plane Surface(" << total_shapes_count << ") = {" << total_shapes_count << "};\n";
                geo_file << "Physical Surface(\"" << material_being_shaped->second << " " << total_shapes_count << "\") = {" << total_shapes_count << "};\n";
                new_start_found = false;
            }
        }
        if (unable_to_complete_shape == true)
        {
            error_reached = true;
        }
        else
        {
            error_reached = false;
        }
        material_being_shaped++;
    }
    if (error_reached == false)
    {
        return EXIT_SUCCESS;
    }
    else
    {
        return EXIT_FAILURE;
    }
}